

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

FT_Error raccess_guess_vfat(FT_Library library,FT_Stream stream,char *base_file_name,
                           char **result_file_name,FT_Long *result_offset)

{
  FT_Error FVar1;
  char *pcVar2;
  
  pcVar2 = raccess_make_file_name(library->memory,base_file_name,"resource.frk/");
  if (pcVar2 == (char *)0x0) {
    FVar1 = 0x40;
  }
  else {
    *result_file_name = pcVar2;
    *result_offset = 0;
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

static FT_Error
  raccess_guess_vfat( FT_Library  library,
                      FT_Stream   stream,
                      char       *base_file_name,
                      char      **result_file_name,
                      FT_Long    *result_offset )
  {
    char*      newpath;
    FT_Memory  memory;

    FT_UNUSED( stream );


    memory = library->memory;

    newpath = raccess_make_file_name( memory, base_file_name,
                                      "resource.frk/" );
    if ( !newpath )
      return FT_THROW( Out_Of_Memory );

    *result_file_name = newpath;
    *result_offset    = 0;

    return FT_Err_Ok;
  }